

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O1

int coda_bin_cursor_get_string_length(coda_cursor *cursor,long *length)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int64_t bit_size;
  ulong local_10;
  
  iVar1 = coda_bin_cursor_get_bit_size(cursor,(int64_t *)&local_10);
  iVar2 = -1;
  if (iVar1 == 0) {
    uVar3 = 0xffffffffffffffff;
    if (-1 < (long)local_10) {
      uVar3 = local_10 >> 3;
    }
    *length = uVar3;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int coda_bin_cursor_get_string_length(const coda_cursor *cursor, long *length)
{
    int64_t bit_size;

    if (coda_bin_cursor_get_bit_size(cursor, &bit_size) != 0)
    {
        return -1;
    }
    if (bit_size < 0)
    {
        *length = -1;
    }
    else
    {
        *length = (long)(bit_size >> 3);
    }

    return 0;
}